

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  LogMessage *pLVar1;
  ulong uVar2;
  string *psVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xa9);
    pLVar1 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=(&local_59,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  psVar3 = this->target_;
  if (psVar3 == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xaa);
    pLVar1 = internal::LogMessage::operator<<(&local_58,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=(&local_59,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
    psVar3 = this->target_;
  }
  uVar2 = psVar3->_M_string_length;
  if (uVar2 < (ulong)(long)count) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xab);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (static_cast<size_t>(count)) <= (target_->size()): ");
    internal::LogFinisher::operator=(&local_59,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
    psVar3 = this->target_;
    uVar2 = psVar3->_M_string_length;
  }
  std::__cxx11::string::resize((ulong)psVar3,(char)uVar2 - (char)count);
  return;
}

Assistant:

void StringOutputStream::BackUp(int count) {
  GOOGLE_CHECK_GE(count, 0);
  GOOGLE_CHECK(target_ != NULL);
  GOOGLE_CHECK_LE(static_cast<size_t>(count), target_->size());
  target_->resize(target_->size() - count);
}